

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O0

void __thiscall
Cylinder_Reintersect_Test::Cylinder_Reintersect_Test(Cylinder_Reintersect_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Cylinder_Reintersect_Test_03740148;
  return;
}

Assistant:

TEST(Cylinder, Reintersect) {
    ParallelFor(0, nReintersect, [](int64_t i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = pExp(rng, 4) * (rng.Uniform<Float>() < 0.5 ? -1 : 1);
        Float zMax = pExp(rng, 4) * (rng.Uniform<Float>() < 0.5 ? -1 : 1);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Cylinder cyl(&identity, &identity, false, radius, zMin, zMax, phiMax);

        EXPECT_EQ(0, TestReintersectConvex(&cyl, rng)) << i;

        Transform tr = randomTransform(rng);
        Transform ti = Inverse(tr);
        Cylinder tcyl(&tr, &ti, false, radius, zMin, zMax, phiMax);
        EXPECT_EQ(0, TestReintersectConvex(&tcyl, rng)) << i;
    });
}